

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O2

int __thiscall List::binarySearch(List *this,char *key)

{
  Node **ppNVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  int iVar6;
  
  if (this->m_sorted == false) {
    poVar4 = std::operator<<((ostream *)&std::cout,"List doesn\'t sorted");
    std::endl<char,std::char_traits<char>>(poVar4);
    uVar3 = 0xffffffff;
  }
  else {
    ppNVar1 = this->m_indexArray;
    iVar6 = 0;
    uVar5 = this->m_listSize - 1;
    while (uVar3 = uVar5, iVar6 < (int)uVar3) {
      uVar5 = uVar3 + iVar6 >> 1;
      iVar2 = strncmp((ppNVar1[uVar5]->field_1).data.publishingHouse,key,3);
      if (iVar2 < 0) {
        iVar6 = uVar5 + 1;
        uVar5 = uVar3;
      }
    }
    iVar6 = strncmp((ppNVar1[(int)uVar3]->field_1).data.publishingHouse,key,3);
    uVar3 = -(uint)(iVar6 != 0) | uVar3;
  }
  return uVar3;
}

Assistant:

int binarySearch(char *key) {
        if (!this->m_sorted) {
            cout << "List doesn't sorted" << endl;
            return -1;
        }
        Node **arr = m_indexArray;
        const int keySize = 3;
        int mid, left = 0, right = m_listSize - 1;
        while (left < right) {
            mid = (left + right) / 2;
            if (strncmp(arr[mid]->data.publishingHouse, key, keySize) < 0) {
                left = mid + 1;
            } else {
                right = mid;
            }
        }
        if (strncmp(arr[right]->data.publishingHouse, key, keySize) == 0) {
            return right;
        } else {
            return -1;
        }
    }